

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O0

void __thiscall PRED<UFPC>::FirstScan(PRED<UFPC> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uchar *puVar5;
  uint *puVar6;
  uint *puVar7;
  uchar *puVar8;
  int local_54;
  int c_1;
  uint *img_labels_row_prev;
  uint *img_labels_row_1;
  uchar *img_row_prev;
  uchar *img_row_1;
  int r;
  int c;
  uint *img_labels_row;
  uchar *img_row;
  int h;
  int w;
  PRED<UFPC> *this_local;
  
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  UFPC::Setup();
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  iVar2 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  puVar5 = cv::Mat::ptr<unsigned_char>
                     (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
  puVar6 = cv::Mat::ptr<unsigned_int>
                     (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,0
                     );
  img_row_1._4_4_ = -1;
  iVar3 = img_row_1._4_4_;
  while (img_row_1._4_4_ = iVar3, iVar3 = img_row_1._4_4_ + 1, iVar3 < iVar1) {
    if (puVar5[iVar3] != '\0') {
      uVar4 = UFPC::NewLabel();
      puVar6[iVar3] = uVar4;
      img_row_1._4_4_ = iVar3;
      while( true ) {
        iVar3 = img_row_1._4_4_ + 1;
        if (iVar1 <= iVar3) goto LAB_001fc368;
        if (puVar5[iVar3] == '\0') break;
        puVar6[iVar3] = puVar6[img_row_1._4_4_];
        img_row_1._4_4_ = iVar3;
      }
    }
  }
LAB_001fc368:
  img_row_1._0_4_ = 1;
  do {
    if (iVar2 <= (int)img_row_1) {
      return;
    }
    puVar5 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        (int)img_row_1);
    puVar8 = puVar5 + -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                   field_0x48;
    puVar6 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,(int)img_row_1);
    puVar7 = (uint *)((long)puVar6 -
                     **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                                 field_0x48);
    local_54 = 0;
    if (iVar1 == 1) {
      if (*puVar5 != '\0') {
        if (*puVar8 == '\0') {
          uVar4 = UFPC::NewLabel();
          *puVar6 = uVar4;
        }
        else {
          *puVar6 = *puVar7;
        }
      }
    }
    else {
      iVar3 = local_54;
      if (*puVar5 == '\0') goto LAB_001fc622;
      if (*puVar8 == '\0') {
        if (puVar8[1] == '\0') {
          uVar4 = UFPC::NewLabel();
          *puVar6 = uVar4;
          goto LAB_001fc58a;
        }
        *puVar6 = puVar7[1];
        goto LAB_001fc541;
      }
      *puVar6 = *puVar7;
LAB_001fc47f:
      iVar3 = local_54 + 1;
      if (iVar3 < iVar1 + -1) {
        if (puVar5[iVar3] == '\0') goto LAB_001fc622;
        if (puVar8[iVar3] == '\0') {
          if (puVar8[local_54 + 2] == '\0') {
            puVar6[iVar3] = puVar6[local_54];
            local_54 = iVar3;
            goto LAB_001fc58a;
          }
          uVar4 = UFPC::Merge(puVar6[local_54],puVar7[local_54 + 2]);
          puVar6[iVar3] = uVar4;
          local_54 = iVar3;
LAB_001fc541:
          do {
            iVar3 = local_54 + 1;
            if (iVar1 + -1 <= iVar3) {
              if (puVar5[iVar3] != '\0') {
                puVar6[iVar3] = puVar7[iVar3];
              }
              goto LAB_001fc8de;
            }
            if (puVar5[iVar3] != '\0') {
              puVar6[iVar3] = puVar7[iVar3];
              local_54 = iVar3;
              goto LAB_001fc47f;
            }
LAB_001fc622:
            while( true ) {
              do {
                local_54 = iVar3;
                iVar3 = local_54 + 1;
                if (iVar1 + -1 <= iVar3) {
                  if (puVar5[iVar3] != '\0') {
                    if (puVar8[iVar3] == '\0') {
                      if (puVar8[local_54] == '\0') {
                        uVar4 = UFPC::NewLabel();
                        puVar6[iVar3] = uVar4;
                      }
                      else {
                        puVar6[iVar3] = puVar7[local_54];
                      }
                    }
                    else {
                      puVar6[iVar3] = puVar7[iVar3];
                    }
                  }
                  goto LAB_001fc8de;
                }
              } while (puVar5[iVar3] == '\0');
              if (puVar8[iVar3] != '\0') {
                puVar6[iVar3] = puVar7[iVar3];
                local_54 = iVar3;
                goto LAB_001fc47f;
              }
              if (puVar8[local_54 + 2] != '\0') break;
              if (puVar8[local_54] == '\0') {
                uVar4 = UFPC::NewLabel();
                puVar6[iVar3] = uVar4;
                local_54 = iVar3;
              }
              else {
                puVar6[iVar3] = puVar7[local_54];
                local_54 = iVar3;
              }
LAB_001fc58a:
              while( true ) {
                iVar3 = local_54 + 1;
                if (iVar1 + -1 <= iVar3) {
                  if (puVar5[iVar3] != '\0') {
                    puVar6[iVar3] = puVar6[local_54];
                  }
                  goto LAB_001fc8de;
                }
                if (puVar5[iVar3] == '\0') break;
                if (puVar8[local_54 + 2] != '\0') {
                  uVar4 = UFPC::Merge(puVar6[local_54],puVar7[local_54 + 2]);
                  puVar6[iVar3] = uVar4;
                  local_54 = iVar3;
                  goto LAB_001fc541;
                }
                puVar6[iVar3] = puVar6[local_54];
                local_54 = iVar3;
              }
            }
            if (puVar8[local_54] == '\0') {
              puVar6[iVar3] = puVar7[local_54 + 2];
              local_54 = iVar3;
            }
            else {
              uVar4 = UFPC::Merge(puVar7[local_54],puVar7[local_54 + 2]);
              puVar6[iVar3] = uVar4;
              local_54 = iVar3;
            }
          } while( true );
        }
        puVar6[iVar3] = puVar7[iVar3];
        local_54 = iVar3;
        goto LAB_001fc47f;
      }
      if (puVar5[iVar3] != '\0') {
        if (puVar8[iVar3] == '\0') {
          puVar6[iVar3] = puVar6[local_54];
        }
        else {
          puVar6[iVar3] = puVar7[iVar3];
        }
      }
    }
LAB_001fc8de:
    img_row_1._0_4_ = (int)img_row_1 + 1;
  } while( true );
}

Assistant:

void FirstScan()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img_row[c]>0
#define CONDITION_P img_row_prev[c-1]>0
#define CONDITION_Q img_row_prev[c]>0
#define CONDITION_R img_row_prev[c+1]>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#define COLS w

        {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(0);

#include "labeling_grana_2016_forest_0.inc.h"
                
        }

        for (int r = 1; r < h; ++r) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
        
#include "labeling_grana_2016_forest.inc.h"  

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
    }